

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_bddPickOneCube(DdManager *ddm,DdNode *node,char *string)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint *puVar8;
  
  iVar3 = 0;
  if (node != (DdNode *)0x0 && string != (char *)0x0) {
    pDVar1 = ddm->one;
    pDVar6 = (DdNode *)((ulong)pDVar1 ^ 1);
    iVar3 = 0;
    if (pDVar6 != node) {
      if (0 < ddm->size) {
        lVar4 = 0;
        do {
          string[lVar4] = '\x02';
          lVar4 = lVar4 + 1;
        } while (lVar4 < ddm->size);
      }
      iVar3 = 1;
      if (pDVar1 != node) {
        do {
          puVar8 = (uint *)((ulong)node & 0xfffffffffffffffe);
          pDVar7 = (DdNode *)((ulong)*(DdNode **)(puVar8 + 4) ^ 1);
          pDVar2 = (DdNode *)((ulong)*(DdNode **)(puVar8 + 6) ^ 1);
          if (((ulong)node & 1) == 0) {
            pDVar7 = *(DdNode **)(puVar8 + 4);
            pDVar2 = *(DdNode **)(puVar8 + 6);
          }
          node = pDVar2;
          if (pDVar7 == pDVar6) {
            string[*puVar8] = '\0';
          }
          else if (pDVar2 == pDVar6) {
            string[*puVar8] = '\x01';
            node = pDVar7;
          }
          else {
            uVar5 = Cudd_Random();
            string[*puVar8] = (byte)(uVar5 >> 0xd) & 1;
            if ((uVar5 >> 0xd & 1) != 0) {
              node = pDVar7;
            }
          }
        } while (node != pDVar1);
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int
Cudd_bddPickOneCube(
  DdManager * ddm,
  DdNode * node,
  char * string)
{
    DdNode *N, *T, *E;
    DdNode *one, *bzero;
    char   dir;
    int    i;

    if (string == NULL || node == NULL) return(0);

    /* The constant 0 function has no on-set cubes. */
    one = DD_ONE(ddm);
    bzero = Cudd_Not(one);
    if (node == bzero) return(0);

    for (i = 0; i < ddm->size; i++) string[i] = 2;

    for (;;) {

        if (node == one) break;

        N = Cudd_Regular(node);

        T = cuddT(N); E = cuddE(N);
        if (Cudd_IsComplement(node)) {
            T = Cudd_Not(T); E = Cudd_Not(E);
        }
        if (T == bzero) {
            string[N->index] = 0;
            node = E;
        } else if (E == bzero) {
            string[N->index] = 1;
            node = T;
        } else {
            dir = (char) ((Cudd_Random() & 0x2000) >> 13);
            string[N->index] = dir;
            node = dir ? T : E;
        }
    }
    return(1);

}